

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CIdExp *exp)

{
  CPrintVisitor *this_00;
  string sStack_78;
  string local_58;
  string local_38;
  
  this->lastVisited = this->lastVisited + 1;
  this_00 = (CPrintVisitor *)&exp->name;
  std::operator<<((ostream *)&std::cout,(string *)this_00);
  std::__cxx11::string::string((string *)&local_58,(string *)this_00);
  ConstructLabel(&local_38,this_00,&local_58,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  AddArrow(this,this->lastVisited);
  std::__cxx11::string::string((string *)&sStack_78,"IdExp",(allocator *)&local_38);
  AddLabel(this,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void CPrintVisitor::Visit(CIdExp &exp) {
	++lastVisited;
	std::cout << exp.name;
	this->description = ConstructLabel(exp.name, lastVisited);
	AddArrow(lastVisited);
	AddLabel("IdExp");
	++lastVisited;
}